

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::identStmt(Parser *this)

{
  Type TVar1;
  Token TVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Lexer *pLVar5;
  long lVar6;
  undefined4 uVar10;
  _Alloc_hider _Var7;
  undefined4 uVar11;
  tuple<flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_> tVar8;
  Report *pRVar9;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> _Var12;
  undefined1 auVar13 [8];
  SymbolTable *pSVar14;
  bool bVar15;
  LiteralType args;
  LiteralType args_1;
  Symbol *pSVar16;
  CallableSym *this_00;
  _List_node_base *p_Var17;
  long *plVar18;
  undefined8 *puVar19;
  Parser *in_RSI;
  SymbolTable *this_01;
  size_type __dnew;
  string name;
  SourceLocation loc;
  list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> symbols;
  _Head_base<0UL,_flow::lang::Symbol_*,_false> local_110;
  undefined1 local_108 [8];
  SymbolTable *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f8;
  _Base_ptr p_Stack_e8;
  pointer local_e0;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> _Stack_d8;
  SymbolTable *local_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  SourceLocation local_a8;
  long *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_48;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_40;
  SymbolTable *local_38;
  
  pLVar5 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  local_a8.filename._M_dataplus._M_p = (pointer)&local_a8.filename.field_2;
  lVar6 = *(long *)&(pLVar5->location_).filename._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,lVar6,(pLVar5->location_).filename._M_string_length + lVar6);
  uVar3 = (pLVar5->location_).end.column;
  uVar10 = (pLVar5->location_).end.offset;
  local_a8.begin.line = (pLVar5->location_).begin.line;
  local_a8.begin.column = (pLVar5->location_).begin.column;
  local_a8.begin.offset = (pLVar5->location_).begin.offset;
  local_a8.end.line = (pLVar5->location_).end.line;
  pLVar5 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  local_c8._0_8_ = &local_b8;
  _Var7._M_p = (pLVar5->stringValue_)._M_dataplus._M_p;
  local_a8.end.column = uVar3;
  local_a8.end.offset = uVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,_Var7._M_p,_Var7._M_p + (pLVar5->stringValue_)._M_string_length);
  Lexer::nextToken((in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
  local_38 = (SymbolTable *)0x0;
  local_48._M_head_impl = (Lexer *)&local_48;
  local_40._M_head_impl = (Lexer *)&local_48;
  pSVar16 = SymbolTable::lookup(in_RSI->scopeStack_,(string *)local_c8,All,
                                (list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *
                                )&local_48);
  if (pSVar16 == (Symbol *)0x0) {
    pLVar5 = (in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    if (pLVar5->token_ == Semicolon) {
      pSVar14 = in_RSI->scopeStack_;
      if (in_RSI->scopeStack_ == (SymbolTable *)0x0) {
        this_01 = (SymbolTable *)0x0;
      }
      else {
        do {
          this_01 = pSVar14;
          pSVar14 = this_01->outerTable_;
        } while (this_01->outerTable_ != (SymbolTable *)0x0);
      }
      this_00 = (CallableSym *)operator_new(200);
      CallableSym::CallableSym(this_00,(string *)local_c8,&local_a8);
      (this_00->super_Symbol).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__HandlerSym_001aeb40;
      this_00[1].super_Symbol.super_ASTNode._vptr_ASTNode = (_func_int **)0x0;
      this_00[1].super_Symbol.super_ASTNode.location_.filename._M_dataplus._M_p = (pointer)0x0;
      local_110._M_head_impl = (Symbol *)this_00;
      pSVar16 = SymbolTable::appendSymbol
                          (this_01,(unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
                                    *)&local_110);
      if ((CallableSym *)local_110._M_head_impl != (CallableSym *)0x0) {
        (*(((Symbol *)&(local_110._M_head_impl)->super_ASTNode)->super_ASTNode)._vptr_ASTNode[1])();
      }
      local_110._M_head_impl = (Symbol *)0x0;
      p_Var17 = (_List_node_base *)operator_new(0x18);
      p_Var17[1]._M_next = (_List_node_base *)pSVar16;
      std::__detail::_List_node_base::_M_hook(p_Var17);
      local_38 = (SymbolTable *)
                 ((long)&(local_38->symbols_).
                         super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
      goto LAB_0012f783;
    }
    pRVar9 = in_RSI->report_;
    local_d0 = (SymbolTable *)0x14;
    local_108 = (undefined1  [8])&aStack_f8;
    local_108 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_108,(ulong)&local_d0);
    aStack_f8._M_allocated_capacity = (size_type)local_d0;
    *(undefined4 *)local_108 = 0x6e6b6e55;
    *(char *)((long)local_108 + 4) = 'o';
    *(char *)((long)local_108 + 5) = 'w';
    *(char *)((long)local_108 + 6) = 'n';
    *(char *)((long)local_108 + 7) = ' ';
    *(char *)((long)local_108 + 8) = 's';
    *(char *)((long)local_108 + 9) = 'y';
    *(char *)((long)local_108 + 10) = 'm';
    *(char *)((long)local_108 + 0xb) = 'b';
    *(char *)((long)local_108 + 0xc) = 'o';
    *(char *)((long)local_108 + 0xd) = 'l';
    *(char *)((long)local_108 + 0xe) = ' ';
    *(char *)((long)local_108 + 0xf) = '\'';
    *(char *)((long)local_108 + 0x10) = '{';
    *(char *)((long)local_108 + 0x11) = '}';
    *(char *)((long)local_108 + 0x12) = '\'';
    *(char *)((long)local_108 + 0x13) = '.';
    local_100 = local_d0;
    *(char *)((long)local_108 + (long)local_d0) = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_c8._0_8_,(pointer)(local_c8._8_8_ + local_c8._0_8_));
    diagnostics::Report::typeError<std::__cxx11::string>
              (pRVar9,&pLVar5->lastLocation_,(string *)local_108,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_108 != (undefined1  [8])&aStack_f8) {
      operator_delete((void *)local_108,aStack_f8._M_allocated_capacity + 1);
    }
LAB_0012f92f:
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  }
  else {
LAB_0012f783:
    TVar1 = pSVar16->type_;
    if (TVar1 - BuiltinFunction < 2) {
      callStmt((Parser *)local_108,
               (list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *)in_RSI);
      auVar13 = local_108;
      if (local_108 == (undefined1  [8])0x0) goto LAB_0012f92f;
      plVar18 = (long *)operator_new(0x48);
      *plVar18 = (long)&PTR__ASTNode_001ae890;
      plVar18[1] = (long)(plVar18 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(plVar18 + 1),*(long *)((long)auVar13 + 8),
                 *(long *)((long)auVar13 + 0x10) + *(long *)((long)auVar13 + 8));
      plVar18[7] = *(long *)((long)auVar13 + 0x38);
      lVar6 = *(long *)((long)auVar13 + 0x30);
      plVar18[5] = *(long *)((long)auVar13 + 0x28);
      plVar18[6] = lVar6;
      *plVar18 = (long)&PTR__ExprStmt_001aed90;
      plVar18[8] = (long)auVar13;
    }
    else if (TVar1 == Handler) {
      local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffffffffff00);
      local_100 = (SymbolTable *)0x0;
      aStack_f8._M_allocated_capacity = 0;
      aStack_f8._8_8_ = 0;
      p_Stack_e8 = (_Base_ptr)0x0;
      local_e0 = (pointer)0x0;
      _Stack_d8._M_head_impl = (Lexer *)0x0;
      puVar19 = (undefined8 *)operator_new(0x80);
      *puVar19 = &PTR__ASTNode_001ae890;
      puVar19[1] = puVar19 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar19 + 1),local_a8.filename._M_dataplus._M_p,
                 (long)(_func_int ***)local_a8.filename._M_string_length +
                 local_a8.filename._M_dataplus._M_p);
      puVar19[7] = CONCAT44(local_a8.end.offset,local_a8.end.column);
      puVar19[5] = CONCAT44(local_a8.begin.column,local_a8.begin.line);
      puVar19[6] = CONCAT44(local_a8.end.line,local_a8.begin.offset);
      *puVar19 = &PTR__CallExpr_001aec70;
      puVar19[8] = pSVar16;
      *(bool *)(puVar19 + 9) = local_108[0];
      puVar19[10] = local_100;
      puVar19[0xb] = aStack_f8._M_allocated_capacity;
      puVar19[0xc] = aStack_f8._8_8_;
      aStack_f8._8_8_ = 0;
      local_100 = (SymbolTable *)0x0;
      aStack_f8._M_allocated_capacity = 0;
      puVar19[0xd] = p_Stack_e8;
      puVar19[0xe] = local_e0;
      ((tuple<flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_> *)(puVar19 + 0xf))->
      super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_> =
           (_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)
           _Stack_d8._M_head_impl;
      _Stack_d8._M_head_impl = (Lexer *)0x0;
      p_Stack_e8 = (_Base_ptr)0x0;
      local_e0 = (pointer)0x0;
      plVar18 = (long *)operator_new(0x48);
      *plVar18 = (long)&PTR__ASTNode_001ae890;
      plVar18[1] = (long)(plVar18 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(plVar18 + 1),puVar19[1],puVar19[2] + puVar19[1]);
      plVar18[7] = puVar19[7];
      lVar6 = puVar19[6];
      plVar18[5] = puVar19[5];
      plVar18[6] = lVar6;
      *plVar18 = (long)&PTR__ExprStmt_001aed90;
      plVar18[8] = (long)puVar19;
      ParamList::~ParamList((ParamList *)local_108);
    }
    else {
      plVar18 = (long *)0x0;
      if (TVar1 == Variable) {
        bVar15 = expect(in_RSI,Assign);
        if (!bVar15) goto LAB_0012f92f;
        Lexer::nextToken((in_RSI->lexer_)._M_t.
                         super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                         .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
        logicExpr((Parser *)&local_70);
        if (local_70 == (long *)0x0) {
          *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        }
        else {
          args = (**(code **)(*pSVar16[1].super_ASTNode._vptr_ASTNode + 0x18))();
          args_1 = (**(code **)(*local_70 + 0x18))(local_70);
          if (args == args_1) {
            pLVar5 = (in_RSI->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
            local_a8.end.offset = (pLVar5->lastLocation_).end.offset;
            uVar4 = (pLVar5->lastLocation_).end.line;
            uVar11 = (pLVar5->lastLocation_).end.column;
            local_a8.end.line = uVar4;
            local_a8.end.column = uVar11;
            plVar18 = (long *)operator_new(0x50);
            *plVar18 = (long)&PTR__ASTNode_001ae890;
            plVar18[1] = (long)(plVar18 + 3);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(plVar18 + 1),local_a8.filename._M_dataplus._M_p,
                       (long)(_func_int ***)local_a8.filename._M_string_length +
                       local_a8.filename._M_dataplus._M_p);
            plVar18[7] = CONCAT44(local_a8.end.offset,local_a8.end.column);
            plVar18[5] = CONCAT44(local_a8.begin.column,local_a8.begin.line);
            plVar18[6] = CONCAT44(local_a8.end.line,local_a8.begin.offset);
            *plVar18 = (long)&PTR__AssignStmt_001aee10;
            plVar18[8] = (long)pSVar16;
            plVar18[9] = (long)local_70;
            goto LAB_0012fa69;
          }
          pLVar5 = (in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
          pRVar9 = in_RSI->report_;
          local_108 = (undefined1  [8])&aStack_f8;
          local_d0 = (SymbolTable *)0x38;
          local_108 = (undefined1  [8])
                      std::__cxx11::string::_M_create((ulong *)local_108,(ulong)&local_d0);
          aStack_f8._M_allocated_capacity = (size_type)local_d0;
          *(char *)((long)local_108 + 0x20) = 'e';
          *(char *)((long)local_108 + 0x21) = 'c';
          *(char *)((long)local_108 + 0x22) = 't';
          *(char *)((long)local_108 + 0x23) = 'e';
          *(char *)((long)local_108 + 0x24) = 'd';
          *(char *)((long)local_108 + 0x25) = ' ';
          *(char *)((long)local_108 + 0x26) = '<';
          *(char *)((long)local_108 + 0x27) = '{';
          *(char *)((long)local_108 + 0x28) = '}';
          *(char *)((long)local_108 + 0x29) = '>';
          *(char *)((long)local_108 + 0x2a) = ' ';
          *(char *)((long)local_108 + 0x2b) = 'b';
          *(char *)((long)local_108 + 0x2c) = 'u';
          *(char *)((long)local_108 + 0x2d) = 't';
          *(char *)((long)local_108 + 0x2e) = ' ';
          *(char *)((long)local_108 + 0x2f) = 'g';
          *(char *)((long)local_108 + 0x10) = ' ';
          *(char *)((long)local_108 + 0x11) = 'a';
          *(char *)((long)local_108 + 0x12) = 's';
          *(char *)((long)local_108 + 0x13) = 's';
          *(char *)((long)local_108 + 0x14) = 'i';
          *(char *)((long)local_108 + 0x15) = 'g';
          *(char *)((long)local_108 + 0x16) = 'n';
          *(char *)((long)local_108 + 0x17) = 'm';
          *(char *)((long)local_108 + 0x18) = 'e';
          *(char *)((long)local_108 + 0x19) = 'n';
          *(char *)((long)local_108 + 0x1a) = 't';
          *(char *)((long)local_108 + 0x1b) = '.';
          *(char *)((long)local_108 + 0x1c) = ' ';
          *(char *)((long)local_108 + 0x1d) = 'E';
          *(char *)((long)local_108 + 0x1e) = 'x';
          *(char *)((long)local_108 + 0x1f) = 'p';
          *(undefined8 *)local_108 = 0x73696d2065707954;
          *(char *)((long)local_108 + 8) = 'm';
          *(char *)((long)local_108 + 9) = 'a';
          *(char *)((long)local_108 + 10) = 't';
          *(char *)((long)local_108 + 0xb) = 'c';
          *(char *)((long)local_108 + 0xc) = 'h';
          *(char *)((long)local_108 + 0xd) = ' ';
          *(char *)((long)local_108 + 0xe) = 'i';
          *(char *)((long)local_108 + 0xf) = 'n';
          *(char *)((long)local_108 + 0x30) = 'o';
          *(char *)((long)local_108 + 0x31) = 't';
          *(char *)((long)local_108 + 0x32) = ' ';
          *(char *)((long)local_108 + 0x33) = '<';
          *(char *)((long)local_108 + 0x34) = '{';
          *(char *)((long)local_108 + 0x35) = '}';
          *(char *)((long)local_108 + 0x36) = '>';
          *(char *)((long)local_108 + 0x37) = '.';
          local_100 = local_d0;
          *(char *)((long)local_108 + (long)local_d0) = '\0';
          diagnostics::Report::typeError<flow::LiteralType,flow::LiteralType>
                    (pRVar9,&pLVar5->lastLocation_,(string *)local_108,args,args_1);
          if (local_108 != (undefined1  [8])&aStack_f8) {
            operator_delete((void *)local_108,aStack_f8._M_allocated_capacity + 1);
          }
          *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
          (**(code **)(*local_70 + 8))(local_70);
        }
        plVar18 = (long *)0x0;
        goto LAB_0012fab0;
      }
    }
LAB_0012fa69:
    TVar2 = ((in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_;
    if ((TVar2 == Unless) || (TVar2 == If)) {
      postscriptStmt(this,(unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                          in_RSI);
      if (plVar18 != (long *)0x0) {
        (**(code **)(*plVar18 + 8))();
      }
    }
    else {
      bVar15 = expect(in_RSI,Semicolon);
      if (!bVar15) {
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        goto LAB_0012fab0;
      }
      Lexer::nextToken((in_RSI->lexer_)._M_t.
                       super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                       .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
      *(long **)&(this->features_)._M_t._M_impl = plVar18;
    }
  }
  plVar18 = (long *)0x0;
LAB_0012fab0:
  _Var12._M_head_impl = local_48._M_head_impl;
  while (_Var12._M_head_impl != (Lexer *)&local_48) {
    tVar8.super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
    super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_> *)
          _Var12._M_head_impl;
    operator_delete(_Var12._M_head_impl,0x18);
    _Var12._M_head_impl =
         (Lexer *)tVar8.
                  super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                  .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  }
  if (plVar18 != (long *)0x0) {
    (**(code **)(*plVar18 + 8))(plVar18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.filename._M_dataplus._M_p != &local_a8.filename.field_2) {
    operator_delete(local_a8.filename._M_dataplus._M_p,
                    local_a8.filename.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::identStmt() {
  // identStmt  ::= callStmt | assignStmt
  // callStmt   ::= NAME ['(' paramList ')' | paramList] (';' | LF)
  // assignStmt ::= NAME '=' expr [';' | LF]
  //
  // NAME may be a builtin-function, builtin-handler, handler-name, or variable.

  SourceLocation loc(location());
  std::string name = stringValue();
  nextToken();  // IDENT

  std::unique_ptr<Stmt> stmt;
  std::list<Symbol*> symbols;
  Symbol* callee = currentScope()->lookup(name, Lookup::All, &symbols);
  if (!callee) {
    // XXX assume that given symbol is a auto forward-declared handler that's
    // being defined later in the source.
    if (token() != Token::Semicolon) {
      report_.typeError(lastLocation(), "Unknown symbol '{}'.", name);
      return nullptr;
    }

    callee = (HandlerSym*)globalScope()->appendSymbol(
        std::make_unique<HandlerSym>(name, loc));
    symbols.push_back(callee);
  }

  switch (callee->type()) {
    case Symbol::Variable: {  // var '=' expr (';' | LF)
      if (!consume(Token::Assign)) return nullptr;

      std::unique_ptr<Expr> value = expr();
      if (!value) return nullptr;

      VariableSym* var = static_cast<VariableSym*>(callee);
      LiteralType leftType = var->initializer()->getType();
      LiteralType rightType = value->getType();
      if (leftType != rightType) {
        report_.typeError(
            lastLocation(),
            "Type mismatch in assignment. Expected <{}> but got <{}>.",
            leftType, rightType);
        return nullptr;
      }

      stmt = std::make_unique<AssignStmt>(var, std::move(value),
                                          loc.update(end()));
      break;
    }
    case Symbol::BuiltinFunction:
    case Symbol::BuiltinHandler: {
      auto call = callStmt(symbols);
      if (!call) {
        return nullptr;
      }
      stmt = std::make_unique<ExprStmt>(std::move(call));
      break;
    }
    case Symbol::Handler:
      stmt = std::make_unique<ExprStmt>(
          std::make_unique<CallExpr>(loc, (CallableSym*)callee, ParamList()));
      break;
    default:
      break;
  }

  // postscript statement handling
  if (testTokens(Token::If, Token::Unless))
      return postscriptStmt(std::move(stmt));

  if (!consume(Token::Semicolon))
    return nullptr;

  return stmt;
}